

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

Value * __thiscall toml::Value::operator=(Value *this,Value *v)

{
  Array *pAVar1;
  pointer pVVar2;
  string *this_00;
  anon_union_8_8_51f126cb_for_Value_2 aVar3;
  
  if (this == v) {
    return this;
  }
  ~Value(this);
  this->type_ = v->type_;
  switch(v->type_) {
  case NULL_TYPE:
  case INT_TYPE:
    aVar3 = v->field_1;
    goto LAB_0015cee7;
  case BOOL_TYPE:
    (this->field_1).bool_ = (v->field_1).bool_;
    break;
  case DOUBLE_TYPE:
    this->field_1 = v->field_1;
    break;
  case STRING_TYPE:
    this_00 = (string *)operator_new(0x20);
    pAVar1 = (v->field_1).array_;
    (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
    pVVar2 = (pAVar1->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,pVVar2,
               (long)&((pAVar1->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_finish)->type_ + (long)pVVar2);
    goto LAB_0015cf06;
  case TIME_TYPE:
    aVar3.null_ = operator_new(8);
    ((aVar3.string_)->_M_dataplus)._M_p = (((v->field_1).string_)->_M_dataplus)._M_p;
LAB_0015cee7:
    (this->field_1).null_ = (void *)aVar3;
    break;
  case ARRAY_TYPE:
    this_00 = (string *)operator_new(0x18);
    std::vector<toml::Value,_std::allocator<toml::Value>_>::vector
              ((vector<toml::Value,_std::allocator<toml::Value>_> *)this_00,
               (vector<toml::Value,_std::allocator<toml::Value>_> *)(v->field_1).string_);
    goto LAB_0015cf06;
  case TABLE_TYPE:
    this_00 = (string *)operator_new(0x30);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                *)this_00,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                *)(v->field_1).string_);
LAB_0015cf06:
    (this->field_1).string_ = this_00;
    break;
  default:
    this->type_ = NULL_TYPE;
    (this->field_1).null_ = (void *)0x0;
  }
  return this;
}

Assistant:

inline Value& Value::operator=(const Value& v)
{
    if (this == &v)
        return *this;

    this->~Value();

    type_ = v.type_;
    switch (v.type_) {
    case NULL_TYPE: null_ = v.null_; break;
    case BOOL_TYPE: bool_ = v.bool_; break;
    case INT_TYPE: int_ = v.int_; break;
    case DOUBLE_TYPE: double_ = v.double_; break;
    case STRING_TYPE: string_ = new std::string(*v.string_); break;
    case TIME_TYPE: time_ = new Time(*v.time_); break;
    case ARRAY_TYPE: array_ = new Array(*v.array_); break;
    case TABLE_TYPE: table_ = new Table(*v.table_); break;
    default:
        assert(false);
        type_ = NULL_TYPE;
        null_ = nullptr;
    }

    return *this;
}